

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::BMI_RL(CPU *this)

{
  byte bVar1;
  
  this->cycles = 2;
  bVar1 = GetByte(this);
  this->pc = this->pc + (short)(char)((char)(this->field_6).ps >> 7 & bVar1);
  return;
}

Assistant:

void CPU::BMI_RL()
{
    cycles = 2;
    uint8_t offset = GetByte();
    pc += (N) ? static_cast<int8_t>(offset) : 0;
}